

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFixtureRunner.cpp
# Opt level: O0

int __thiscall ut11::detail::TestFixtureRunner::Run(TestFixtureRunner *this,Output *output)

{
  int iVar1;
  int iVar2;
  TestFixtureResults TVar3;
  vector<std::shared_ptr<ut11::detail::TestFixtureAbstract>,_std::allocator<std::shared_ptr<ut11::detail::TestFixtureAbstract>_>_>
  local_58;
  size_t local_40;
  TestFixtureResults results;
  vector<std::shared_ptr<ut11::detail::TestFixtureAbstract>,_std::allocator<std::shared_ptr<ut11::detail::TestFixtureAbstract>_>_>
  fixtures;
  Output *output_local;
  TestFixtureRunner *this_local;
  
  (*output->_vptr_Output[2])();
  GetFixtures((vector<std::shared_ptr<ut11::detail::TestFixtureAbstract>,_std::allocator<std::shared_ptr<ut11::detail::TestFixtureAbstract>_>_>
               *)&results.succeeded,this);
  std::
  vector<std::shared_ptr<ut11::detail::TestFixtureAbstract>,_std::allocator<std::shared_ptr<ut11::detail::TestFixtureAbstract>_>_>
  ::vector(&local_58,
           (vector<std::shared_ptr<ut11::detail::TestFixtureAbstract>,_std::allocator<std::shared_ptr<ut11::detail::TestFixtureAbstract>_>_>
            *)&results.succeeded);
  TVar3 = RunTestFixtures(&local_58,output);
  results.ran = TVar3.succeeded;
  local_40 = TVar3.ran;
  std::
  vector<std::shared_ptr<ut11::detail::TestFixtureAbstract>,_std::allocator<std::shared_ptr<ut11::detail::TestFixtureAbstract>_>_>
  ::~vector(&local_58);
  (*output->_vptr_Output[3])(output,local_40,results.ran);
  iVar2 = (int)results.ran;
  iVar1 = (int)local_40;
  std::
  vector<std::shared_ptr<ut11::detail::TestFixtureAbstract>,_std::allocator<std::shared_ptr<ut11::detail::TestFixtureAbstract>_>_>
  ::~vector((vector<std::shared_ptr<ut11::detail::TestFixtureAbstract>,_std::allocator<std::shared_ptr<ut11::detail::TestFixtureAbstract>_>_>
             *)&results.succeeded);
  return iVar1 - iVar2;
}

Assistant:

int ut11::detail::TestFixtureRunner::Run(out::Output& output)
{
	output.Begin();

	auto fixtures = GetFixtures();
	auto results = RunTestFixtures(fixtures, output);

	output.Finish(results.ran, results.succeeded);
	return results.ran - results.succeeded;
}